

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

CaseFold * re2::LookupCaseFold(CaseFold *f,int n,Rune r)

{
  int iVar1;
  int m;
  CaseFold *ef;
  Rune r_local;
  int n_local;
  CaseFold *f_local;
  CaseFold *local_8;
  
  iVar1 = n;
  f_local = f;
  while( true ) {
    n_local = iVar1;
    if (n_local < 1) {
      if (f_local < f + n) {
        local_8 = f_local;
      }
      else {
        local_8 = (CaseFold *)0x0;
      }
      return local_8;
    }
    iVar1 = n_local / 2;
    if ((f_local[iVar1].lo <= r) && (r <= f_local[iVar1].hi)) break;
    if (f_local[iVar1].lo <= r) {
      f_local = f_local + (iVar1 + 1);
      iVar1 = n_local - (iVar1 + 1);
    }
  }
  return f_local + iVar1;
}

Assistant:

const CaseFold* LookupCaseFold(const CaseFold *f, int n, Rune r) {
  const CaseFold* ef = f + n;

  // Binary search for entry containing r.
  while (n > 0) {
    int m = n/2;
    if (f[m].lo <= r && r <= f[m].hi)
      return &f[m];
    if (r < f[m].lo) {
      n = m;
    } else {
      f += m+1;
      n -= m+1;
    }
  }

  // There is no entry that contains r, but f points
  // where it would have been.  Unless f points at
  // the end of the array, it points at the next entry
  // after r.
  if (f < ef)
    return f;

  // No entry contains r; no entry contains runes > r.
  return NULL;
}